

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeThreadData.cpp
# Opt level: O2

void __thiscall RuntimeThreadData::~RuntimeThreadData(RuntimeThreadData *this)

{
  CloseHandle(this->hevntInitialScriptCompleted);
  CloseHandle(this->hevntReceivedBroadcast);
  CloseHandle(this->hevntShutdown);
  CloseHandle(this->hThread);
  DeleteCriticalSection(&this->csReportQ);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&(this->reportQ).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  std::__cxx11::_List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>::_M_clear
            (&(this->children).
              super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>);
  std::__cxx11::string::~string((string *)&this->initialSource);
  return;
}

Assistant:

RuntimeThreadData::~RuntimeThreadData()
{
    CloseHandle(this->hevntInitialScriptCompleted);
    CloseHandle(this->hevntReceivedBroadcast);
    CloseHandle(this->hevntShutdown);
    CloseHandle(this->hThread);
    DeleteCriticalSection(&csReportQ);
}